

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringbuffer.h
# Opt level: O2

Ch * __thiscall
rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
          (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this)

{
  char *pcVar1;
  
  pcVar1 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&this->stack_,1);
  *pcVar1 = '\0';
  internal::Stack<rapidjson::CrtAllocator>::Pop<char>(&this->stack_,1);
  return (this->stack_).stack_;
}

Assistant:

const Ch* GetString() const {
        // Push and pop a null terminator. This is safe.
        *stack_.template Push<Ch>() = '\0';
        stack_.template Pop<Ch>(1);

        return stack_.template Bottom<Ch>();
    }